

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

Vec4 __thiscall glcts::BlendHardLight(glcts *this,Vec4 *src,Vec4 *dst)

{
  float fVar1;
  Vec4 VVar2;
  Vec4 rgb;
  Vec4 local_18;
  
  fVar1 = src->m_data[0];
  if (fVar1 <= 0.5) {
    local_18.m_data[0] = (fVar1 + fVar1) * dst->m_data[0];
  }
  else {
    local_18.m_data[0] = (1.0 - fVar1) * -2.0 * (1.0 - dst->m_data[0]) + 1.0;
  }
  fVar1 = src->m_data[1];
  if (fVar1 <= 0.5) {
    local_18.m_data[1] = (fVar1 + fVar1) * dst->m_data[1];
  }
  else {
    local_18.m_data[1] = (1.0 - fVar1) * -2.0 * (1.0 - dst->m_data[1]) + 1.0;
  }
  fVar1 = src->m_data[2];
  if (fVar1 <= 0.5) {
    local_18.m_data[2] = (fVar1 + fVar1) * dst->m_data[2];
  }
  else {
    local_18.m_data[2] = (1.0 - fVar1) * -2.0 * (1.0 - dst->m_data[2]) + 1.0;
  }
  local_18.m_data[3] = 0.0;
  VVar2 = Blend(&local_18,src,dst);
  return (Vec4)VVar2.m_data;
}

Assistant:

static tcu::Vec4 BlendHardLight(const tcu::Vec4& src, const tcu::Vec4& dst)
{
	tcu::Vec4 rgb(HardLight(src[0], dst[0]), HardLight(src[1], dst[1]), HardLight(src[2], dst[2]), 0.f);

	return Blend(rgb, src, dst);
}